

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

int __thiscall FuncProto::copy(FuncProto *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  ProtoStore *pPVar2;
  
  this->model = *(ProtoModel **)dst;
  this->extrapop = *(int4 *)(dst + 0x10);
  this->flags = *(uint4 *)(dst + 0x14);
  if (this->store != (ProtoStore *)0x0) {
    (*this->store->_vptr_ProtoStore[1])();
  }
  if (*(long **)(dst + 8) == (long *)0x0) {
    pPVar2 = (ProtoStore *)0x0;
  }
  else {
    pPVar2 = (ProtoStore *)(**(code **)(**(long **)(dst + 8) + 0x50))();
  }
  this->store = pPVar2;
  std::vector<EffectRecord,_std::allocator<EffectRecord>_>::operator=
            (&this->effectlist,(vector<EffectRecord,_std::allocator<EffectRecord>_> *)(dst + 0x18));
  std::vector<VarnodeData,_std::allocator<VarnodeData>_>::operator=
            (&this->likelytrash,(vector<VarnodeData,_std::allocator<VarnodeData>_> *)(dst + 0x30));
  iVar1 = *(int *)(dst + 0x48);
  this->injectid = iVar1;
  return iVar1;
}

Assistant:

void FuncProto::copy(const FuncProto &op2)

{
  model = op2.model;
  extrapop = op2.extrapop;
  flags = op2.flags;
  if (store != (ProtoStore *)0)
    delete store;
  if (op2.store != (ProtoStore *)0)
    store = op2.store->clone();
  else
    store = (ProtoStore *)0;
  effectlist = op2.effectlist;
  likelytrash = op2.likelytrash;
  injectid = op2.injectid;
}